

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

cmStringRange __thiscall cmStateDirectory::GetLinkOptionsEntries_abi_cxx11_(cmStateDirectory *this)

{
  PointerType pBVar1;
  PointerType pSVar2;
  cmStringRange cVar3;
  cmStateDirectory *this_local;
  
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&(this->Snapshot_).Position);
  cVar3 = GetPropertyContent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,unsigned_long>
                    (&pBVar1->LinkOptions,pSVar2->LinkOptionsPosition);
  return cVar3;
}

Assistant:

cmStringRange cmStateDirectory::GetLinkOptionsEntries() const
{
  return GetPropertyContent(this->DirectoryState->LinkOptions,
                            this->Snapshot_.Position->LinkOptionsPosition);
}